

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad.h
# Opt level: O3

void __thiscall quad::set_bounding_box(quad *this)

{
  aabb bbox_diagonal2;
  aabb bbox_diagonal1;
  point3 local_b8;
  point3 local_98;
  aabb local_78;
  aabb local_48;
  
  local_78.y.min = (this->Q).e[2] + (this->u).e[2] + (this->v).e[2];
  local_78.x.min = (this->v).e[0] + (this->u).e[0] + (this->Q).e[0];
  local_78.x.max = (this->v).e[1] + (this->u).e[1] + (this->Q).e[1];
  aabb::aabb(&local_48,&this->Q,(point3 *)&local_78);
  local_b8.e[2] = (this->Q).e[2];
  local_98.e[2] = (this->u).e[2] + local_b8.e[2];
  local_b8.e[0] = (this->Q).e[0];
  local_b8.e[1] = (this->Q).e[1];
  local_98.e[0] = (this->u).e[0] + local_b8.e[0];
  local_98.e[1] = (this->u).e[1] + local_b8.e[1];
  local_b8.e[2] = local_b8.e[2] + (this->v).e[2];
  local_b8.e[0] = (this->v).e[0] + local_b8.e[0];
  local_b8.e[1] = (this->v).e[1] + local_b8.e[1];
  aabb::aabb(&local_78,&local_98,&local_b8);
  (this->bbox).x.min =
       (double)(~-(ulong)(local_48.x.min <= local_78.x.min) & (ulong)local_78.x.min |
               (ulong)local_48.x.min & -(ulong)(local_48.x.min <= local_78.x.min));
  (this->bbox).x.max =
       (double)(~-(ulong)(local_78.x.max <= local_48.x.max) & (ulong)local_78.x.max |
               (ulong)local_48.x.max & -(ulong)(local_78.x.max <= local_48.x.max));
  (this->bbox).y.min =
       (double)(~-(ulong)(local_48.y.min <= local_78.y.min) & (ulong)local_78.y.min |
               (ulong)local_48.y.min & -(ulong)(local_48.y.min <= local_78.y.min));
  (this->bbox).y.max =
       (double)(~-(ulong)(local_78.y.max <= local_48.y.max) & (ulong)local_78.y.max |
               (ulong)local_48.y.max & -(ulong)(local_78.y.max <= local_48.y.max));
  (this->bbox).z.min =
       (double)(~-(ulong)(local_48.z.min <= local_78.z.min) & (ulong)local_78.z.min |
               (ulong)local_48.z.min & -(ulong)(local_48.z.min <= local_78.z.min));
  (this->bbox).z.max =
       (double)(~-(ulong)(local_78.z.max <= local_48.z.max) & (ulong)local_78.z.max |
               (ulong)local_48.z.max & -(ulong)(local_78.z.max <= local_48.z.max));
  return;
}

Assistant:

virtual void set_bounding_box() {
        // Compute the bounding box of all four vertices.
        auto bbox_diagonal1 = aabb(Q, Q + u + v);
        auto bbox_diagonal2 = aabb(Q + u, Q + v);
        bbox = aabb(bbox_diagonal1, bbox_diagonal2);
    }